

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

SFormat lj_strfmt_parse(FormatState *fs)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  byte *in_RAX;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  MSize MVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  pbVar1 = fs->p;
  pbVar2 = fs->e;
  fs->str = (char *)pbVar1;
  pbVar6 = pbVar1;
  pbVar9 = pbVar1;
  if (pbVar1 < pbVar2) {
    lVar10 = 0;
    pbVar8 = pbVar1 + 1;
    do {
      uVar3 = (uint)in_RAX;
      if (pbVar8[-1] == 0x25) {
        if (*pbVar8 != 0x25) {
          if (lVar10 != 0) {
            pbVar8 = pbVar8 + -1;
            goto LAB_00117e3c;
          }
          bVar4 = *pbVar8;
          uVar3 = (uint)bVar4;
          uVar11 = 0;
          if (0x10 < bVar4 - 0x20) goto LAB_00117d69;
          uVar11 = 0;
          uVar3 = (uint)bVar4;
          goto LAB_00117d0e;
        }
        pbVar6 = pbVar8 + 1;
        pbVar9 = pbVar8;
        break;
      }
      in_RAX = pbVar8 + 1;
      lVar10 = lVar10 + -1;
      bVar12 = pbVar8 != pbVar2;
      pbVar6 = pbVar2;
      pbVar9 = pbVar2;
      pbVar8 = in_RAX;
    } while (bVar12);
  }
  goto LAB_00117e44;
LAB_00117d0e:
  do {
    if (bVar4 < 0x2b) {
      if (bVar4 == 0x20) {
        uVar5 = 0x800;
      }
      else {
        if (bVar4 != 0x23) break;
        uVar5 = 0x1000;
      }
    }
    else if (bVar4 == 0x30) {
      uVar5 = 0x400;
    }
    else {
      uVar5 = 0x100;
      if (bVar4 != 0x2d) {
        if (bVar4 != 0x2b) break;
        uVar5 = 0x200;
      }
    }
    uVar11 = uVar11 | uVar5;
    bVar4 = pbVar8[1];
    pbVar8 = pbVar8 + 1;
    uVar3 = (uint)bVar4;
  } while (bVar4 - 0x20 < 0x11);
LAB_00117d69:
  uVar3 = uVar3 - 0x30;
  if (uVar3 < 10) {
    pbVar6 = pbVar8 + 1;
    pbVar9 = pbVar8 + 1;
    uVar5 = (*pbVar9 - 0x30) + uVar3 * 10;
    pbVar8 = pbVar8 + 2;
    if (9 < *pbVar9 - 0x30) {
      uVar5 = uVar3;
      pbVar8 = pbVar6;
    }
    uVar11 = uVar11 | uVar5 << 0x10;
  }
  if (*pbVar8 == 0x2e) {
    uVar3 = pbVar8[1] - 0x30;
    if (uVar3 < 10) {
      pbVar6 = pbVar8 + 2;
      if (*pbVar6 - 0x30 < 10) {
        pbVar8 = pbVar8 + 3;
        uVar3 = (*pbVar6 - 0x30) + uVar3 * 10;
      }
      else {
        pbVar8 = pbVar8 + 2;
      }
    }
    else {
      pbVar8 = pbVar8 + 1;
      uVar3 = 0;
    }
    uVar11 = uVar11 | uVar3 * 0x1000000 + 0x1000000;
  }
  uVar5 = *pbVar8 - 0x41;
  if (uVar5 < 0x38) {
    uVar3 = 0xff7fff8e;
    if ((0x6a3e82ff7fff8eU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      bVar4 = "\x05"[uVar5];
      fs->p = pbVar8 + 1;
      uVar3 = (uint)(uVar5 < 0x20) << 0xd | uVar11 | (uint)bVar4;
    }
    if ((0x6a3e82ff7fff8eU >> ((byte)uVar5 & 0x3f) & 1) != 0) goto LAB_00117e26;
  }
  else {
LAB_00117e26:
    pbVar8 = pbVar8 + (0x1f < *pbVar8);
    fs->len = (int)pbVar8 - (int)pbVar1;
    fs->p = pbVar2;
    uVar3 = 1;
  }
LAB_00117e3c:
  pbVar6 = pbVar8;
  pbVar9 = pbVar8;
  if (lVar10 == 0) {
    return uVar3;
  }
LAB_00117e44:
  fs->p = pbVar6;
  MVar7 = (int)pbVar9 - (int)pbVar1;
  fs->len = MVar7;
  return (uint)(MVar7 != 0) * 2;
}

Assistant:

SFormat LJ_FASTCALL lj_strfmt_parse(FormatState *fs)
{
  const uint8_t *p = fs->p, *e = fs->e;
  fs->str = (const char *)p;
  for (; p < e; p++) {
    if (*p == '%') {  /* Escape char? */
      if (p[1] == '%') {  /* '%%'? */
	fs->p = ++p+1;
	goto retlit;
      } else {
	SFormat sf = 0;
	uint32_t c;
	if (p != (const uint8_t *)fs->str)
	  break;
	for (p++; (uint32_t)*p - ' ' <= (uint32_t)('0' - ' '); p++) {
	  /* Parse flags. */
	  if (*p == '-') sf |= STRFMT_F_LEFT;
	  else if (*p == '+') sf |= STRFMT_F_PLUS;
	  else if (*p == '0') sf |= STRFMT_F_ZERO;
	  else if (*p == ' ') sf |= STRFMT_F_SPACE;
	  else if (*p == '#') sf |= STRFMT_F_ALT;
	  else break;
	}
	if ((uint32_t)*p - '0' < 10) {  /* Parse width. */
	  uint32_t width = (uint32_t)*p++ - '0';
	  if ((uint32_t)*p - '0' < 10)
	    width = (uint32_t)*p++ - '0' + width*10;
	  sf |= (width << STRFMT_SH_WIDTH);
	}
	if (*p == '.') {  /* Parse precision. */
	  uint32_t prec = 0;
	  p++;
	  if ((uint32_t)*p - '0' < 10) {
	    prec = (uint32_t)*p++ - '0';
	    if ((uint32_t)*p - '0' < 10)
	      prec = (uint32_t)*p++ - '0' + prec*10;
	  }
	  sf |= ((prec+1) << STRFMT_SH_PREC);
	}
	/* Parse conversion. */
	c = (uint32_t)*p - 'A';
	if (LJ_LIKELY(c <= (uint32_t)('x' - 'A'))) {
	  uint32_t sx = strfmt_map[c];
	  if (sx) {
	    fs->p = p+1;
	    return (sf | sx | ((c & 0x20) ? 0 : STRFMT_F_UPPER));
	  }
	}
	/* Return error location. */
	if (*p >= 32) p++;
	fs->len = (MSize)(p - (const uint8_t *)fs->str);
	fs->p = fs->e;
	return STRFMT_ERR;
      }
    }
  }
  fs->p = p;
retlit:
  fs->len = (MSize)(p - (const uint8_t *)fs->str);
  return fs->len ? STRFMT_LIT : STRFMT_EOF;
}